

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

AssertionResult * __thiscall Catch::AssertionResult::getExpression_abi_cxx11_(AssertionResult *this)

{
  bool bVar1;
  long in_RSI;
  AssertionResult *this_local;
  
  bVar1 = isFalseTest(*(int *)(in_RSI + 0x68));
  if (bVar1) {
    std::operator+((char *)this,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"!");
  }
  else {
    std::__cxx11::string::string((string *)this,(string *)(in_RSI + 0x48));
  }
  return this;
}

Assistant:

std::string AssertionResult::getExpression() const {
		if (isFalseTest(m_info.resultDisposition))
			return "!" + m_info.capturedExpression;
		else
			return m_info.capturedExpression;
	}